

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

my_rational my_rational_sum(my_rational *a,my_rational *b)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  wchar_t wVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  my_rational mVar9;
  uint uVar10;
  uint uVar11;
  uint numerator;
  uint a_00;
  int iVar12;
  uint16_t a_u16n [2];
  uint16_t q_u16n [2];
  uint16_t b_u16n [2];
  uint16_t d_u16n [4];
  uint16_t n_u16n [5];
  uint16_t sr_u16n [7];
  uint16_t w_u16n [5];
  uint16_t r_u16n [5];
  uint16_t rr_u16n [7];
  
  uVar5 = b->d;
  uVar6 = uVar5;
  uVar3 = a->d;
  while (uVar10 = uVar6, uVar10 != 0) {
    uVar6 = uVar3 % uVar10;
    uVar3 = uVar10;
  }
  uVar1 = (ulong)a->d / (ulong)uVar3;
  uVar6 = a->n;
  uVar10 = (uint)uVar1;
  a_00 = (uint)((ulong)uVar5 / (ulong)uVar3);
  if (((((int)(uVar5 * uVar1 >> 0x20) != 0) ||
       ((int)(((ulong)uVar5 / (ulong)uVar3) * (ulong)uVar6 >> 0x20) != 0)) ||
      ((int)(uVar1 * b->n >> 0x20) != 0)) ||
     (uVar3 = a_00 * uVar6, uVar11 = b->n * uVar10, numerator = uVar11 + uVar3, CARRY4(uVar11,uVar3)
     )) {
    _Var2 = ini_u16n(a_u16n,2,uVar6);
    if (_Var2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x79c,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var2 = ini_u16n(b_u16n,2,a_00);
    if (_Var2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7a0,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var2 = mul_u16n(sr_u16n,a_u16n,b_u16n,4,2,2);
    if (_Var2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7a5,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var2 = ini_u16n(a_u16n,2,uVar10);
    if (_Var2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7a9,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var2 = ini_u16n(b_u16n,2,b->n);
    if (_Var2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7ad,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var2 = mul_u16n(n_u16n + 1,a_u16n,b_u16n,4,2,2);
    if (_Var2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7b2,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    n_u16n[0] = addip_u16n(n_u16n + 1,sr_u16n,4,4);
    _Var2 = ini_u16n(b_u16n,2,b->d);
    if (_Var2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7b8,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var2 = mul_u16n(d_u16n,a_u16n,b_u16n,4,2,2);
    if (_Var2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7bd,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    wVar4 = div_u16n(q_u16n,r_u16n,w_u16n,n_u16n,d_u16n,2,5,4);
    numerator = 0xffffffff;
    uVar10 = 1;
    if (wVar4 == L'\0') {
      sVar7 = msb_u16n(q_u16n,2);
      if (sVar7 < 0x21) {
        uVar5 = ext_u16n(q_u16n,2);
        if (uVar5 == 0xffffffff) {
          uVar10 = 1;
        }
        else {
          uVar10 = (uint)(0xffffffff / (ulong)(uVar5 + 1));
        }
        _Var2 = ini_u16n(a_u16n,2,uVar10);
        if (_Var2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x7ce,
                        "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                       );
        }
        _Var2 = mul_u16n(sr_u16n,r_u16n,a_u16n,7,5,2);
        if (_Var2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x7d4,
                        "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                       );
        }
        wVar4 = div_u16n(q_u16n,rr_u16n,w_u16n,sr_u16n,d_u16n,2,7,4);
        if (wVar4 != L'\0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x7da,
                        "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                       );
        }
        sVar7 = msb_u16n(q_u16n,2);
        if (0x20 < sVar7) {
          __assert_fail("msb_u16n(q_u16n, MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x7dd,
                        "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                       );
        }
        uVar6 = ext_u16n(q_u16n,2);
        iVar12 = uVar6 + uVar5 * uVar10;
        if (CARRY4(uVar6,uVar5 * uVar10)) {
          if (uVar10 != 1) {
            __assert_fail("resd == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x7e9,
                          "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                         );
          }
          uVar10 = 1;
        }
        else {
          sVar7 = msb_u16n(rr_u16n,7);
          sVar8 = msb_u16n(d_u16n,4);
          numerator = (uint)(iVar12 != -1 && sVar8 <= sVar7 + 1) + iVar12;
        }
      }
    }
  }
  else {
    uVar10 = uVar10 * uVar5;
  }
  mVar9 = my_rational_construct(numerator,uVar10);
  return mVar9;
}

Assistant:

struct my_rational my_rational_sum(const struct my_rational *a,
		const struct my_rational *b)
{
	unsigned int g = gcd(a->d, b->d);
	unsigned int adr = a->d / g, bdr = b->d / g;
	unsigned int resn, resd;

	if (adr <= UINT_MAX / b->d
			&& a->n <= UINT_MAX / bdr
			&& b->n <= UINT_MAX / adr
			&& a->n * bdr <= UINT_MAX - b->n * adr) {
		resn = a->n * bdr + b->n * adr;
		resd = adr * b->d;
	} else {
		/* Overflows in native arithmetic so approximate. */
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
		uint16_t a_u16n[MP_DIGITS], b_u16n[MP_DIGITS];
		uint16_t n_u16n[2 * MP_DIGITS + 1], d_u16n[2 * MP_DIGITS];
		uint16_t q_u16n[MP_DIGITS], r_u16n[2 * MP_DIGITS + 1];
		uint16_t sr_u16n[3 * MP_DIGITS + 1], rr_u16n[3 * MP_DIGITS + 1];
		uint16_t w_u16n[2 * MP_DIGITS + 1];
		bool over;

		over = ini_u16n(a_u16n, MP_DIGITS, a->n);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, bdr);
		if (over) {
			assert(0);
		}
		over = mul_u16n(sr_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = ini_u16n(a_u16n, MP_DIGITS, adr);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, b->n);
		if (over) {
			assert(0);
		}
		over = mul_u16n(n_u16n + 1, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		n_u16n[0] = addip_u16n(n_u16n + 1, sr_u16n, 2 * MP_DIGITS,
			2 * MP_DIGITS);
		over = ini_u16n(b_u16n, MP_DIGITS, b->d);
		if (over) {
			assert(0);
		}
		over = mul_u16n(d_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = (div_u16n(q_u16n, r_u16n, w_u16n, n_u16n, d_u16n,
			MP_DIGITS, 2 * MP_DIGITS + 1, 2 * MP_DIGITS) != 0);
		if (!over && msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT) {
			unsigned int t;

			resn = ext_u16n(q_u16n, MP_DIGITS);
			/*
			 * Use as large as a numerator as possible so the
			 * approximation is as accurate as possible.
			 */
			resd = (resn < UINT_MAX) ? UINT_MAX / (resn + 1) : 1;
			resn *= resd;
			over = ini_u16n(a_u16n, MP_DIGITS, resd);
			if (over) {
				assert(0);
			}
			over = mul_u16n(sr_u16n, r_u16n, a_u16n,
				3 * MP_DIGITS + 1, 2 * MP_DIGITS + 1,
				MP_DIGITS);
			if (over) {
				assert(0);
			}
			over = (div_u16n(q_u16n, rr_u16n, w_u16n, sr_u16n,
				d_u16n, MP_DIGITS, 3 * MP_DIGITS + 1,
				2 * MP_DIGITS) != 0);
			if (over) {
				assert(0);
			}
			assert(msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT);
			t = ext_u16n(q_u16n, MP_DIGITS);
			if (resn <= UINT_MAX - t) {
				resn += t;
				/* Approximate rounding to the nearest. */
				if (msb_u16n(rr_u16n, 3 * MP_DIGITS + 1) + 1
						>= msb_u16n(d_u16n,
						2 * MP_DIGITS)
						&& resn < UINT_MAX) {
					++resn;
				}
			} else {
				assert(resd == 1);
				resn = UINT_MAX;
			}
		} else {
			resn = UINT_MAX;
			resd = 1;
		}
#undef MP_DIGITS
	}
	return my_rational_construct(resn, resd);
}